

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rle.cpp
# Opt level: O0

unique_ptr<duckdb::AnalyzeState,_std::default_delete<duckdb::AnalyzeState>,_true>
duckdb::RLEInitAnalyze<unsigned_long>(ColumnData *col_data,PhysicalType type)

{
  BlockManager *block_manager;
  undefined1 in_DL;
  ColumnData *in_RSI;
  _Head_base<0UL,_duckdb::AnalyzeState_*,_false> in_RDI;
  CompressionInfo info;
  _Head_base<0UL,_duckdb::AnalyzeState_*,_false> this;
  CompressionInfo local_20;
  undefined7 in_stack_ffffffffffffffe8;
  
  this._M_head_impl = in_RDI._M_head_impl;
  block_manager = ColumnData::GetBlockManager(in_RSI);
  CompressionInfo::CompressionInfo(&local_20,block_manager);
  make_uniq<duckdb::RLEAnalyzeState<unsigned_long>,duckdb::CompressionInfo&>
            ((CompressionInfo *)CONCAT17(in_DL,in_stack_ffffffffffffffe8));
  unique_ptr<duckdb::AnalyzeState,std::default_delete<duckdb::AnalyzeState>,true>::
  unique_ptr<duckdb::RLEAnalyzeState<unsigned_long>,std::default_delete<duckdb::unique_ptr<duckdb::AnalyzeState,std::default_delete<duckdb::AnalyzeState>,true>::unique_ptr>,void>
            ((unique_ptr<duckdb::AnalyzeState,_std::default_delete<duckdb::AnalyzeState>,_true> *)
             this._M_head_impl,
             (unique_ptr<duckdb::RLEAnalyzeState<unsigned_long>,_std::default_delete<duckdb::RLEAnalyzeState<unsigned_long>_>_>
              *)in_RDI._M_head_impl);
  unique_ptr<duckdb::RLEAnalyzeState<unsigned_long>,_std::default_delete<duckdb::RLEAnalyzeState<unsigned_long>_>,_true>
  ::~unique_ptr((unique_ptr<duckdb::RLEAnalyzeState<unsigned_long>,_std::default_delete<duckdb::RLEAnalyzeState<unsigned_long>_>,_true>
                 *)0xa622fe);
  return (unique_ptr<duckdb::AnalyzeState,_std::default_delete<duckdb::AnalyzeState>_>)
         (_Tuple_impl<0UL,_duckdb::AnalyzeState_*,_std::default_delete<duckdb::AnalyzeState>_>)
         this._M_head_impl;
}

Assistant:

unique_ptr<AnalyzeState> RLEInitAnalyze(ColumnData &col_data, PhysicalType type) {
	CompressionInfo info(col_data.GetBlockManager());
	return make_uniq<RLEAnalyzeState<T>>(info);
}